

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btorsimbv.c
# Opt level: O2

uint32_t btorsim_bv_get_num_leading_zeros(BtorSimBitVector *bv)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  uVar3 = 0;
  uVar1 = bv->width;
  while ((uVar1 = uVar1 - 1, uVar2 = bv->width, uVar1 != 0xffffffff &&
         (uVar2 = uVar3, ((&bv[1].width)[~(uVar1 >> 5) + bv->len] >> (uVar1 & 0x1f) & 1) == 0))) {
    uVar3 = uVar3 + 1;
  }
  return uVar2;
}

Assistant:

uint32_t
btorsim_bv_get_num_leading_zeros (const BtorSimBitVector *bv)
{
  assert (bv);

  uint32_t i, res;

  for (i = bv->width - 1, res = 0; i < UINT_MAX; i--)
  {
    if (btorsim_bv_get_bit (bv, i)) break;
    res += 1;
  }

  return res;
}